

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> *
pbrt::Image::resampleWeights(int oldRes,int newRes)

{
  float fVar1;
  reference pvVar2;
  int in_EDX;
  int in_ESI;
  vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> *in_RDI;
  Float FVar3;
  double dVar4;
  int j_1;
  Float invSumWts;
  Float pos;
  int j;
  Float center;
  int i;
  Float filterwidth;
  int vb;
  int va;
  vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> *wt;
  undefined8 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  allocator_type *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float fVar5;
  char (*in_stack_ffffffffffffff98) [7];
  vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> *pvVar6;
  int local_50;
  int in_stack_ffffffffffffffb4;
  float fVar7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar8;
  LogLevel in_stack_ffffffffffffffc4;
  int iVar9;
  char (*in_stack_ffffffffffffffd0) [7];
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  
  if (in_ESI <= in_EDX) {
    pvVar6 = in_RDI;
    std::allocator<pbrt::ResampleWeight>::allocator((allocator<pbrt::ResampleWeight> *)0x54fd14);
    std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::vector
              ((vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::allocator<pbrt::ResampleWeight>::~allocator((allocator<pbrt::ResampleWeight> *)0x54fd37);
    for (iVar9 = 0; iVar9 < in_EDX; iVar9 = iVar9 + 1) {
      dVar4 = std::floor((double)(ulong)(uint)(((((float)iVar9 + 0.5) * (float)in_ESI) /
                                                (float)in_EDX - 2.0) + 0.5));
      pvVar2 = std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::operator[]
                         (in_RDI,(long)iVar9);
      pvVar2->firstTexel = (int)SUB84(dVar4,0);
      for (iVar8 = 0; iVar8 < 4; iVar8 = iVar8 + 1) {
        std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::operator[]
                  (in_RDI,(long)iVar9);
        FVar3 = WindowedSinc((Float)in_stack_ffffffffffffff50,
                             (Float)((ulong)in_stack_ffffffffffffff48 >> 0x20),
                             (Float)in_stack_ffffffffffffff48);
        pvVar2 = std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::
                 operator[](in_RDI,(long)iVar9);
        pvVar2->weight[iVar8] = FVar3;
      }
      pvVar2 = std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::operator[]
                         (in_RDI,(long)iVar9);
      fVar5 = pvVar2->weight[0];
      pvVar2 = std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::operator[]
                         (in_RDI,(long)iVar9);
      fVar7 = pvVar2->weight[1];
      pvVar2 = std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::operator[]
                         (in_RDI,(long)iVar9);
      fVar1 = pvVar2->weight[2];
      pvVar2 = std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::operator[]
                         (in_RDI,(long)iVar9);
      fVar5 = 1.0 / (fVar5 + fVar7 + fVar1 + pvVar2->weight[3]);
      for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
        fVar7 = fVar5;
        pvVar2 = std::vector<pbrt::ResampleWeight,_std::allocator<pbrt::ResampleWeight>_>::
                 operator[](in_RDI,(long)iVar9);
        pvVar2->weight[local_50] = fVar5 * pvVar2->weight[local_50];
        fVar5 = fVar7;
      }
    }
    return pvVar6;
  }
  LogFatal<char_const(&)[7],char_const(&)[7],char_const(&)[7],int&,char_const(&)[7],int&>
            (in_stack_ffffffffffffffc4,
             (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb4,(char *)in_RDI,(char (*) [7])in_RDI,in_stack_ffffffffffffff98
             ,in_stack_ffffffffffffffd0,
             (int *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
             (char (*) [7])CONCAT44(in_EDX,in_ESI),(int *)CONCAT44(in_ESI,in_EDX));
}

Assistant:

std::vector<ResampleWeight> Image::resampleWeights(int oldRes, int newRes) {
    CHECK_GE(newRes, oldRes);
    std::vector<ResampleWeight> wt(newRes);
    Float filterwidth = 2.f;
    for (int i = 0; i < newRes; ++i) {
        // Compute image resampling weights for _i_th texel
        Float center = (i + .5f) * oldRes / newRes;
        wt[i].firstTexel = std::floor((center - filterwidth) + 0.5f);
        for (int j = 0; j < 4; ++j) {
            Float pos = wt[i].firstTexel + j + .5f;
            wt[i].weight[j] = WindowedSinc(pos - center, filterwidth, 2.f);
        }

        // Normalize filter weights for texel resampling
        Float invSumWts =
            1 / (wt[i].weight[0] + wt[i].weight[1] + wt[i].weight[2] + wt[i].weight[3]);
        for (int j = 0; j < 4; ++j)
            wt[i].weight[j] *= invSumWts;
    }
    return wt;
}